

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

char * cmExpandVariablesInString(void *arg,char *source,int escapeQuotes,int atOnly)

{
  char *pcVar1;
  string result;
  string barf;
  allocator local_61;
  char *local_60;
  long local_58;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,source,(allocator *)&local_60);
  pcVar1 = cmMakefile::ExpandVariablesInString
                     ((cmMakefile *)arg,&local_40,escapeQuotes != 0,atOnly != 0,false,(char *)0x0,-1
                      ,false,false);
  std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
  pcVar1 = (char *)malloc(local_58 + 1);
  if (local_58 != 0) {
    strcpy(pcVar1,local_60);
  }
  pcVar1[local_58] = '\0';
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return pcVar1;
}

Assistant:

char CCONV* cmExpandVariablesInString(void* arg, const char* source,
                                      int escapeQuotes, int atOnly)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  std::string barf = source;
  std::string result = mf->ExpandVariablesInString(
    barf, (escapeQuotes ? true : false), (atOnly ? true : false));
  char* res = static_cast<char*>(malloc(result.size() + 1));
  if (!result.empty()) {
    strcpy(res, result.c_str());
  }
  res[result.size()] = '\0';
  return res;
}